

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,u8 **pzBuffer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Select *pSVar4;
  ExprList *pEVar5;
  Window *pWVar6;
  Expr *pEVar7;
  Expr *local_70;
  Expr *local_68;
  char *zToken;
  int local_48;
  u32 nSize;
  int nToken;
  int nNewSize;
  uint nStructSize;
  u32 staticFlag;
  u8 *zAlloc;
  Expr *pNew;
  u8 **pzBuffer_local;
  Expr *pEStack_18;
  int dupFlags_local;
  Expr *p_local;
  sqlite3 *db_local;
  
  pNew = (Expr *)pzBuffer;
  pzBuffer_local._4_4_ = dupFlags;
  pEStack_18 = p;
  p_local = (Expr *)db;
  if (pzBuffer == (u8 **)0x0) {
    iVar3 = dupedExprSize(p,dupFlags);
    _nStructSize = (u8 *)sqlite3DbMallocRawNN(db,(long)iVar3);
    nNewSize = 0;
  }
  else {
    _nStructSize = *pzBuffer;
    nNewSize = 0x8000;
  }
  zAlloc = _nStructSize;
  if (_nStructSize != (u8 *)0x0) {
    uVar1 = dupedExprStructSize(pEStack_18,pzBuffer_local._4_4_);
    if (((pEStack_18->flags & 0x400) == 0) && ((pEStack_18->u).zToken != (char *)0x0)) {
      local_48 = sqlite3Strlen30((pEStack_18->u).zToken);
      local_48 = local_48 + 1;
    }
    else {
      local_48 = 0;
    }
    if (pzBuffer_local._4_4_ == 0) {
      uVar2 = exprStructSize(pEStack_18);
      memcpy(_nStructSize,pEStack_18,(ulong)uVar2);
      if (uVar2 < 0x48) {
        memset(_nStructSize + uVar2,0,0x48 - (ulong)uVar2);
      }
    }
    else {
      memcpy(_nStructSize,pEStack_18,(long)(int)(uVar1 & 0xfff));
    }
    *(uint *)(zAlloc + 4) = *(uint *)(zAlloc + 4) & 0xfffe1fff;
    *(uint *)(zAlloc + 4) = uVar1 & 0x6000 | *(uint *)(zAlloc + 4);
    *(uint *)(zAlloc + 4) = nNewSize | *(uint *)(zAlloc + 4);
    if (local_48 != 0) {
      *(u8 **)(zAlloc + 8) = _nStructSize + (int)(uVar1 & 0xfff);
      memcpy(_nStructSize + (int)(uVar1 & 0xfff),(pEStack_18->u).zToken,(long)local_48);
    }
    if (((pEStack_18->flags | *(uint *)(zAlloc + 4)) & 0x804000) == 0) {
      if ((pEStack_18->flags & 0x800) == 0) {
        pEVar5 = sqlite3ExprListDup((sqlite3 *)p_local,(pEStack_18->x).pList,pzBuffer_local._4_4_);
        *(ExprList **)(zAlloc + 0x20) = pEVar5;
      }
      else {
        pSVar4 = sqlite3SelectDup((sqlite3 *)p_local,(pEStack_18->x).pSelect,pzBuffer_local._4_4_);
        *(Select **)(zAlloc + 0x20) = pSVar4;
      }
    }
    if ((*(uint *)(zAlloc + 4) & 0x1006000) == 0) {
      if ((pEStack_18->flags & 0x804000) == 0) {
        if (*zAlloc == 0xa6) {
          *(Expr **)(zAlloc + 0x10) = pEStack_18->pLeft;
        }
        else {
          pEVar7 = sqlite3ExprDup((sqlite3 *)p_local,pEStack_18->pLeft,0);
          *(Expr **)(zAlloc + 0x10) = pEVar7;
        }
        pEVar7 = sqlite3ExprDup((sqlite3 *)p_local,pEStack_18->pRight,0);
        *(Expr **)(zAlloc + 0x18) = pEVar7;
      }
    }
    else {
      iVar3 = dupedExprNodeSize(pEStack_18,pzBuffer_local._4_4_);
      _nStructSize = _nStructSize + iVar3;
      if ((*(uint *)(zAlloc + 4) & 0x804000) == 0) {
        if (pEStack_18->pLeft == (Expr *)0x0) {
          local_68 = (Expr *)0x0;
        }
        else {
          local_68 = exprDup((sqlite3 *)p_local,pEStack_18->pLeft,1,(u8 **)&nStructSize);
        }
        *(Expr **)(zAlloc + 0x10) = local_68;
        if (pEStack_18->pRight == (Expr *)0x0) {
          local_70 = (Expr *)0x0;
        }
        else {
          local_70 = exprDup((sqlite3 *)p_local,pEStack_18->pRight,1,(u8 **)&nStructSize);
        }
        *(Expr **)(zAlloc + 0x18) = local_70;
      }
      if ((pEStack_18->flags & 0x1000000) != 0) {
        pWVar6 = sqlite3WindowDup((sqlite3 *)p_local,(Expr *)zAlloc,(pEStack_18->y).pWin);
        *(Window **)(zAlloc + 0x40) = pWVar6;
      }
      if (pNew != (Expr *)0x0) {
        *(u8 **)pNew = _nStructSize;
      }
    }
  }
  return (Expr *)zAlloc;
}

Assistant:

static Expr *exprDup(sqlite3 *db, Expr *p, int dupFlags, u8 **pzBuffer){
  Expr *pNew;           /* Value to return */
  u8 *zAlloc;           /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pzBuffer==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pzBuffer ){
    zAlloc = *pzBuffer;
    staticFlag = EP_Static;
  }else{
    zAlloc = sqlite3DbMallocRawNN(db, dupedExprSize(p, dupFlags));
    staticFlag = 0;
  }
  pNew = (Expr *)zAlloc;

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    const int nNewSize = nStructSize & 0xfff;
    int nToken;
    if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30(p->u.zToken) + 1;
    }else{
      nToken = 0;
    }
    if( dupFlags ){
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      memcpy(zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){ 
        memset(&zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static|EP_MemToken);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;

    /* Copy the p->u.zToken string, if any. */
    if( nToken ){
      char *zToken = pNew->u.zToken = (char*)&zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
    }

    if( 0==((p->flags|pNew->flags) & (EP_TokenOnly|EP_Leaf)) ){
      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprHasProperty(p, EP_xIsSelect) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList, dupFlags);
      }
    }

    /* Fill in pNew->pLeft and pNew->pRight. */
    if( ExprHasProperty(pNew, EP_Reduced|EP_TokenOnly|EP_WinFunc) ){
      zAlloc += dupedExprNodeSize(p, dupFlags);
      if( !ExprHasProperty(pNew, EP_TokenOnly|EP_Leaf) ){
        pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &zAlloc) : 0;
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &zAlloc) : 0;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        pNew->y.pWin = sqlite3WindowDup(db, pNew, p->y.pWin);
        assert( ExprHasProperty(pNew, EP_WinFunc) );
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */
      if( pzBuffer ){
        *pzBuffer = zAlloc;
      }
    }else{
      if( !ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
        if( pNew->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->iColumn==0 || p->pRight==0 );
          assert( p->pRight==0  || p->pRight==p->pLeft );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
  }
  return pNew;
}